

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

void __thiscall wasm::PassRunner::addDefaultGlobalOptimizationPrePasses(PassRunner *this)

{
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,"duplicate-function-elimination","");
  addIfNoDWARFIssues(this,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (1 < (this->options).optimizeLevel) {
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c0,"remove-unused-module-elements","");
    addIfNoDWARFIssues(this,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"memory-packing","");
  addIfNoDWARFIssues(this,&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if (1 < (this->options).optimizeLevel) {
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"once-reduction","");
    addIfNoDWARFIssues(this,&local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
  }
  if ((((this->wasm->features).features & 0x400) != 0) && (1 < (this->options).optimizeLevel)) {
    if ((this->options).closedWorld == true) {
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"type-refining","");
      addIfNoDWARFIssues(this,&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"signature-pruning","");
      addIfNoDWARFIssues(this,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"signature-refining","");
      addIfNoDWARFIssues(this,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
    }
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"global-refining","");
    addIfNoDWARFIssues(this,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((this->options).closedWorld == true) {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"gto","");
      addIfNoDWARFIssues(this,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"remove-unused-module-elements","");
    addIfNoDWARFIssues(this,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((this->options).closedWorld == true) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"remove-unused-types","");
      addIfNoDWARFIssues(this,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"cfp","");
      addIfNoDWARFIssues(this,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"gsi","");
      addIfNoDWARFIssues(this,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"abstract-type-refining","");
      addIfNoDWARFIssues(this,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void PassRunner::addDefaultGlobalOptimizationPrePasses() {
  // Removing duplicate functions is fast and saves work later.
  addIfNoDWARFIssues("duplicate-function-elimination");
  // Do a global cleanup before anything heavy, as it is fairly fast and can
  // save a lot of work if there is a significant amount of dead code.
  if (options.optimizeLevel >= 2) {
    addIfNoDWARFIssues("remove-unused-module-elements");
  }
  addIfNoDWARFIssues("memory-packing");
  if (options.optimizeLevel >= 2) {
    addIfNoDWARFIssues("once-reduction");
  }
  if (wasm->features.hasGC() && options.optimizeLevel >= 2) {
    if (options.closedWorld) {
      addIfNoDWARFIssues("type-refining");
      addIfNoDWARFIssues("signature-pruning");
      addIfNoDWARFIssues("signature-refining");
    }
    addIfNoDWARFIssues("global-refining");
    // Global type optimization can remove fields that are not needed, which can
    // remove ref.funcs that were once assigned to vtables but are no longer
    // needed, which can allow more code to be removed globally. After those,
    // constant field propagation can be more effective.
    if (options.closedWorld) {
      addIfNoDWARFIssues("gto");
    }
    addIfNoDWARFIssues("remove-unused-module-elements");
    if (options.closedWorld) {
      addIfNoDWARFIssues("remove-unused-types");
      addIfNoDWARFIssues("cfp");
      addIfNoDWARFIssues("gsi");
      addIfNoDWARFIssues("abstract-type-refining");
    }
  }
  // TODO: generate-global-effects here, right before function passes, then
  //       discard in addDefaultGlobalOptimizationPostPasses? the benefit seems
  //       quite minor so far, except perhaps when using call.without.effects
  //       which can lead to more opportunities for global effects to matter.
}